

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall
Assimp::ValidateDSProcess::DoValidationEx<aiCamera>
          (ValidateDSProcess *this,aiCamera **parray,uint size,char *firstName,char *secondName)

{
  bool bVar1;
  char *msg;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (size != 0) {
    if (parray == (aiCamera **)0x0) {
      ReportError(this,"aiScene::%s is NULL (aiScene::%s is %i)",firstName,secondName,(ulong)size);
    }
    uVar3 = 1;
    uVar4 = 0;
    while (uVar4 != size) {
      if (parray[uVar4] == (aiCamera *)0x0) {
        msg = "aiScene::%s[%u] is NULL (aiScene::%s is %u)";
        uVar2 = (ulong)size;
LAB_0031f2e1:
        ReportError(this,msg,firstName,uVar4 & 0xffffffff,secondName,uVar2);
      }
      Validate(this,parray[uVar4]);
      for (uVar2 = uVar3; uVar2 < size; uVar2 = uVar2 + 1) {
        this = (ValidateDSProcess *)parray[uVar4];
        bVar1 = aiString::operator==((aiString *)this,&parray[uVar2]->mName);
        if (bVar1) {
          msg = "aiScene::%s[%u] has the same name as aiScene::%s[%u]";
          uVar2 = uVar2 & 0xffffffff;
          goto LAB_0031f2e1;
        }
      }
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

inline void ValidateDSProcess::DoValidationEx(T** parray, unsigned int size,
    const char* firstName, const char* secondName)
{
    // validate all entries
    if (size)
    {
        if (!parray)    {
            ReportError("aiScene::%s is NULL (aiScene::%s is %i)",
                firstName, secondName, size);
        }
        for (unsigned int i = 0; i < size;++i)
        {
            if (!parray[i])
            {
                ReportError("aiScene::%s[%u] is NULL (aiScene::%s is %u)",
                    firstName,i,secondName,size);
            }
            Validate(parray[i]);

            // check whether there are duplicate names
            for (unsigned int a = i+1; a < size;++a)
            {
                if (parray[i]->mName == parray[a]->mName)
                {
                	ReportError("aiScene::%s[%u] has the same name as "
                        "aiScene::%s[%u]",firstName, i,secondName, a);
                }
            }
        }
    }
}